

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
* vkt::api::anon_unknown_1::ComputePipeline::createMultiple
            (vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
             *__return_storage_ptr__,Environment *env,Resources *res,Parameters *param_3,
            vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
            *pOutHandles,VkResult *pOutResult)

{
  DeviceInterface *pDVar1;
  VkDevice pVVar2;
  Deleter<vk::Handle<(vk::HandleType)18>_> deleter;
  VkStructureType *pVVar3;
  bool bVar4;
  int iVar5;
  Handle<(vk::HandleType)14> *pHVar6;
  Handle<(vk::HandleType)16> *pHVar7;
  size_type sVar8;
  Handle<(vk::HandleType)15> *pHVar9;
  reference pvVar10;
  Move<vk::Handle<(vk::HandleType)18>> *this;
  ulong uVar11;
  Deleter<vk::Handle<(vk::HandleType)18>_> local_128;
  deUint64 local_110;
  Handle<(vk::HandleType)18> local_108;
  SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_> local_100;
  Handle<(vk::HandleType)18> local_f0;
  uint local_e8;
  undefined1 local_e1;
  deUint32 i;
  allocator<vk::VkComputePipelineCreateInfo> local_c1;
  undefined1 local_c0 [8];
  vector<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
  pipelineInfos;
  VkPipeline *pHandles;
  undefined1 local_98 [4];
  deUint32 numPipelines;
  VkComputePipelineCreateInfo commonPipelineInfo;
  VkResult *pOutResult_local;
  vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
  *pOutHandles_local;
  Parameters *param_2_local;
  Resources *res_local;
  Environment *env_local;
  vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
  *pipelines;
  
  local_98 = (undefined1  [4])0x1d;
  commonPipelineInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  commonPipelineInfo._4_4_ = 0;
  commonPipelineInfo.pNext._0_4_ = 0;
  commonPipelineInfo.flags = 0x12;
  commonPipelineInfo.stage.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  commonPipelineInfo.stage._4_4_ = 0;
  commonPipelineInfo.stage.pNext._0_4_ = 0;
  commonPipelineInfo.stage.pNext._4_4_ = 0x20;
  commonPipelineInfo._88_8_ = pOutResult;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     (&(res->shaderModule).object.super_RefBase<vk::Handle<(vk::HandleType)14>_>);
  commonPipelineInfo.stage._16_8_ = pHVar6->m_internal;
  commonPipelineInfo.stage.module.m_internal = (long)"pre_main" + 4;
  commonPipelineInfo.stage.pName = (char *)0x0;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                     (&(res->layout).object.super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  commonPipelineInfo.stage.pSpecializationInfo = (VkSpecializationInfo *)pHVar7->m_internal;
  ::vk::Handle<(vk::HandleType)18>::Handle
            ((Handle<(vk::HandleType)18> *)&commonPipelineInfo.layout,0);
  commonPipelineInfo.basePipelineHandle.m_internal._0_4_ = 0;
  sVar8 = std::
          vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>::
          size(pOutHandles);
  pipelineInfos.
  super__Vector_base<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                ::operator[](pOutHandles,0);
  std::allocator<vk::VkComputePipelineCreateInfo>::allocator(&local_c1);
  std::vector<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>::
  vector((vector<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
          *)local_c0,sVar8 & 0xffffffff,(value_type *)local_98,&local_c1);
  std::allocator<vk::VkComputePipelineCreateInfo>::~allocator(&local_c1);
  pDVar1 = env->vkd;
  pVVar2 = env->device;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::operator*
                     (&(res->pipelineCache).object.super_RefBase<vk::Handle<(vk::HandleType)15>_>);
  _i = pHVar9->m_internal;
  pvVar10 = std::
            vector<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
            ::operator[]((vector<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
                          *)local_c0,0);
  iVar5 = (*pDVar1->_vptr_DeviceInterface[0x31])
                    (pDVar1,pVVar2,_i,sVar8 & 0xffffffff,pvVar10,env->allocationCallbacks,
                     pipelineInfos.
                     super__Vector_base<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  *(int *)commonPipelineInfo._88_8_ = iVar5;
  local_e1 = 0;
  std::
  vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::vector(__return_storage_ptr__);
  for (local_e8 = 0; local_e8 < (uint)sVar8; local_e8 = local_e8 + 1) {
    uVar11 = (ulong)local_e8;
    pVVar3 = &(pipelineInfos.
               super__Vector_base<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage)->sType;
    ::vk::Handle<(vk::HandleType)18>::Handle(&local_f0,0);
    bVar4 = ::vk::Handle<(vk::HandleType)18>::operator!=
                      ((Handle<(vk::HandleType)18> *)(pVVar3 + uVar11 * 2),&local_f0);
    if (bVar4) {
      this = (Move<vk::Handle<(vk::HandleType)18>> *)operator_new(0x20);
      local_110 = *(deUint64 *)
                   (&(pipelineInfos.
                      super__Vector_base<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->sType +
                   (ulong)local_e8 * 2);
      local_108.m_internal =
           (deUint64)::vk::refdetails::check<vk::Handle<(vk::HandleType)18>>(local_110);
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::Deleter
                (&local_128,env->vkd,env->device,env->allocationCallbacks);
      deleter.m_device = local_128.m_device;
      deleter.m_deviceIface = local_128.m_deviceIface;
      deleter.m_allocator = local_128.m_allocator;
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>>::Move<vk::Handle<(vk::HandleType)18>>
                (this,(Checked<vk::Handle<(vk::HandleType)18>_>)local_108.m_internal,deleter);
      de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>::SharedPtr
                (&local_100,(Move<vk::Handle<(vk::HandleType)18>_> *)this);
      std::
      vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
      ::push_back(__return_storage_ptr__,&local_100);
      de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>::~SharedPtr(&local_100);
    }
  }
  local_e1 = 1;
  std::vector<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>::
  ~vector((vector<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
           *)local_c0);
  return __return_storage_ptr__;
}

Assistant:

static vector<VkPipelineSp> createMultiple (const Environment& env, const Resources& res, const Parameters&, vector<VkPipeline>* const pOutHandles, VkResult* const pOutResult)
	{
		DE_ASSERT(pOutResult);
		DE_ASSERT(pOutHandles);
		DE_ASSERT(pOutHandles->size() != 0);

		const VkComputePipelineCreateInfo	commonPipelineInfo	=
		{
			VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO,
			DE_NULL,
			(VkPipelineCreateFlags)0,
			{
				VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,
				DE_NULL,
				(VkPipelineShaderStageCreateFlags)0,
				VK_SHADER_STAGE_COMPUTE_BIT,
				*res.shaderModule.object,
				"main",
				DE_NULL					// pSpecializationInfo
			},
			*res.layout.object,
			(VkPipeline)0,				// basePipelineHandle
			0u,							// basePipelineIndex
		};

		const deUint32						numPipelines	= static_cast<deUint32>(pOutHandles->size());
		VkPipeline*	const					pHandles		= &(*pOutHandles)[0];
		vector<VkComputePipelineCreateInfo>	pipelineInfos	(numPipelines, commonPipelineInfo);

		*pOutResult = env.vkd.createComputePipelines(env.device, *res.pipelineCache.object, numPipelines, &pipelineInfos[0], env.allocationCallbacks, pHandles);

		vector<VkPipelineSp>	pipelines;

		// Even if an error is returned, some pipelines may have been created successfully
		for (deUint32 i = 0; i < numPipelines; ++i)
		{
			if (pHandles[i] != DE_NULL)
				pipelines.push_back(VkPipelineSp(new Move<VkPipeline>(check<VkPipeline>(pHandles[i]), Deleter<VkPipeline>(env.vkd, env.device, env.allocationCallbacks))));
		}

		return pipelines;
	}